

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall Statement::Action(Statement *this)

{
  SymbolName SVar1;
  int iVar2;
  compile_errcode cVar3;
  StatementList *pSVar4;
  SymbolQueue *this_00;
  allocator local_7d;
  SymbolType function_type;
  string local_78;
  string funtion_name;
  string str;
  
  function_type = SymbolTableTree::GetCurrentTableType(symbol_table_tree);
  std::__cxx11::string::string
            ((string *)&funtion_name,(string *)&symbol_table_tree->current_table_name);
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  SymbolQueue::SetCacheLocate(handle_correct_queue);
  if (SVar1 == L_CURLY_BRACKET_SYM) {
    SymbolQueue::NextSymbol(handle_correct_queue);
    pSVar4 = (StatementList *)operator_new(0x1f0);
    StatementList::StatementList(pSVar4);
    this->m_statement_list_ptr = pSVar4;
    iVar2 = (*(pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface[2])(pSVar4);
    pSVar4 = this->m_statement_list_ptr;
    if (iVar2 != 0) {
      if (pSVar4 != (StatementList *)0x0) {
        StatementList::~StatementList(pSVar4);
      }
      operator_delete(pSVar4);
      goto LAB_00139fad;
    }
    (*(pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar4);
    pSVar4 = this->m_statement_list_ptr;
    if (pSVar4 != (StatementList *)0x0) {
      StatementList::~StatementList(pSVar4);
    }
    operator_delete(pSVar4);
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (SVar1 != R_CURLY_BRACKET_SYM) {
LAB_00139f7e:
      cVar3 = -1;
      goto LAB_00139fcc;
    }
LAB_00139fbe:
    SymbolQueue::NextSymbol(handle_correct_queue);
  }
  else {
    cVar3 = OutputStatement::Action(&this->m_output_statement);
    if (cVar3 == 0) {
      OutputStatement::LogOutput(&this->m_output_statement);
LAB_00139fad:
      SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
      if (SVar1 == SEMICOLON_SYM) goto LAB_00139fbe;
      fwrite("expected a \':\' in the end of statement\n",0x27,1,_stderr);
    }
    else {
      this_00 = handle_correct_queue;
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = InputStatement::Action((InputStatement *)this_00);
      if (cVar3 == 0) {
        InputStatement::LogOutput(&this->m_input_statement);
        goto LAB_00139fad;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      std::__cxx11::string::string((string *)&local_78,(string *)&funtion_name);
      cVar3 = ReturnStatement::Action(&this->m_return_statement,&function_type,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (cVar3 == 0) {
        ReturnStatement::LogOutput(&this->m_return_statement);
        goto LAB_00139fad;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = AssignStatement::Action(&this->m_assign_statement);
      if (cVar3 == 0) {
        AssignStatement::LogOutput(&this->m_assign_statement);
        goto LAB_00139fad;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = FunctionCall::Action(&this->m_function_call);
      if (cVar3 == 0) {
        FunctionCall::LogOutput(&this->m_function_call);
        goto LAB_00139fad;
      }
      SymbolQueue::SetCurrentLocate(handle_correct_queue);
      cVar3 = ConditionStatement::Action(&this->m_condition_statement);
      if (cVar3 == 0) {
        ConditionStatement::LogOutput(&this->m_condition_statement);
      }
      else {
        SymbolQueue::SetCurrentLocate(handle_correct_queue);
        cVar3 = WhileLoopStatement::Action(&this->m_while_loop_statement);
        if (cVar3 == 0) {
          WhileLoopStatement::LogOutput(&this->m_while_loop_statement);
        }
        else {
          SymbolQueue::SetCurrentLocate(handle_correct_queue);
          cVar3 = SwitchStatement::Action(&this->m_switch_statement);
          if (cVar3 == 0) {
            SwitchStatement::LogOutput(&this->m_switch_statement);
          }
          else {
            SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
            if (SVar1 != SEMICOLON_SYM) goto LAB_00139f7e;
            SymbolQueue::NextSymbol(handle_correct_queue);
            std::__cxx11::string::string((string *)&str,"This is a empty statement",&local_7d);
            std::__cxx11::string::~string((string *)&str);
          }
        }
      }
    }
  }
  cVar3 = 0;
LAB_00139fcc:
  std::__cxx11::string::~string((string *)&funtion_name);
  return cVar3;
}

Assistant:

compile_errcode Statement::Action() {
    int ret = COMPILE_OK;
    SymbolType function_type;
    function_type = symbol_table_tree->GetCurrentTableType();
    string funtion_name = symbol_table_tree->GetCurrentTableName();
    SymbolName name = handle_correct_queue->GetCurrentName();
    handle_correct_queue->SetCacheLocate();
    if (name == L_CURLY_BRACKET_SYM) {
        handle_correct_queue->NextSymbol();
        m_statement_list_ptr = new StatementList;
        if ((ret = m_statement_list_ptr->Action()) == COMPILE_OK) {
            m_statement_list_ptr->LogOutput();
            delete(m_statement_list_ptr);
            name = handle_correct_queue->GetCurrentName();
            if (name == R_CURLY_BRACKET_SYM) {
                handle_correct_queue->NextSymbol();
                goto NO_SEMICOLON;
            } else {
                return NOT_MATCH;
            }
        } else {
            delete(m_statement_list_ptr);
            NOT_MATCH;
        }
    } else if ((ret = m_output_statement.Action()) == COMPILE_OK) {
        m_output_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_input_statement.Action()) == COMPILE_OK) {
        m_input_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_return_statement.Action(function_type, funtion_name)) == COMPILE_OK) {
        m_return_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_assign_statement.Action()) == COMPILE_OK) {
        m_assign_statement.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_function_call.Action()) == COMPILE_OK) {
        m_function_call.LogOutput();
        goto SEMICOLON_CHECK;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_condition_statement.Action()) == COMPILE_OK) {
        m_condition_statement.LogOutput();
        goto NO_SEMICOLON;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_while_loop_statement.Action()) == COMPILE_OK) {
        m_while_loop_statement.LogOutput();
        goto NO_SEMICOLON;
    } else if (handle_correct_queue->SetCurrentLocate(), (ret = m_switch_statement.Action()) == COMPILE_OK) {
        m_switch_statement.LogOutput();
        goto NO_SEMICOLON;
    } else {
        name = handle_correct_queue->GetCurrentName();
        if (name == SEMICOLON_SYM) {
            handle_correct_queue->NextSymbol();
            string str("This is a empty statement");
            return COMPILE_OK;
        } else {
            return NOT_MATCH;
        }
    }
    SEMICOLON_CHECK:
        name = handle_correct_queue->GetCurrentName();
        if (name == SEMICOLON_SYM) {
            handle_correct_queue->NextSymbol();
            return COMPILE_OK;
        } else {
            fprintf(stderr, "expected a ':' in the end of statement\n");
            return COMPILE_OK;
        }
    NO_SEMICOLON:
        return COMPILE_OK;
}